

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtabbar.cpp
# Opt level: O1

void QTabBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  byte *pbVar1;
  int iVar2;
  long *plVar3;
  QSize *pQVar4;
  TextElideMode *pTVar5;
  TextElideMode TVar6;
  byte bVar7;
  ushort uVar8;
  QSize QVar9;
  long lVar10;
  ushort uVar11;
  int iVar12;
  QTabBarPrivate *pQVar13;
  long in_FS_OFFSET;
  undefined4 local_50;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  undefined4 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_4c = *_a[1];
    iVar12 = 0;
    break;
  case 1:
    local_4c = *_a[1];
    iVar12 = 1;
    break;
  case 2:
    local_4c = *_a[1];
    local_50 = *_a[2];
    local_38 = &local_50;
    iVar12 = 2;
    break;
  case 3:
    local_4c = *_a[1];
    iVar12 = 3;
    break;
  case 4:
    local_4c = *_a[1];
    iVar12 = 4;
    break;
  case 5:
    setCurrentIndex((QTabBar *)_o,*_a[1]);
  default:
    goto switchD_0049856a_default;
  }
  puStack_40 = &local_4c;
  local_48 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar12,&local_48);
switchD_0049856a_default:
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_0049854e_caseD_3;
      plVar3 = (long *)_a[1];
      if (((code *)*plVar3 == currentChanged) && (plVar3[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_0049854e_caseD_3;
      }
      if (((code *)*plVar3 == tabCloseRequested) && (plVar3[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_0049854e_caseD_3;
      }
      if (((code *)*plVar3 == tabMoved) && (plVar3[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_0049854e_caseD_3;
      }
      if (((code *)*plVar3 == tabBarClicked) && (plVar3[1] == 0)) {
        *(undefined4 *)*_a = 3;
        goto switchD_0049854e_caseD_3;
      }
      if (((code *)*plVar3 == tabBarDoubleClicked) && (plVar3[1] == 0)) {
        *(undefined4 *)*_a = 4;
        goto switchD_0049854e_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_0049854e_caseD_3;
        goto switchD_0049854e_caseD_1;
      }
    }
    goto switchD_0049854e_caseD_2;
  }
switchD_0049854e_caseD_1:
  if (0xd < (uint)_id) goto LAB_004988a3;
  pQVar4 = (QSize *)*_a;
  switch(_id) {
  case 0:
    iVar12 = *(int *)(*(long *)(_o + 8) + 0x2b4);
    break;
  case 1:
    iVar2 = *(int *)(*(long *)(_o + 8) + 700);
    if ((long)iVar2 < 0) {
      iVar12 = -1;
    }
    else {
      iVar12 = -1;
      if ((ulong)(long)iVar2 < *(ulong *)(*(long *)(_o + 8) + 0x2e8)) {
        iVar12 = iVar2;
      }
    }
    break;
  case 2:
    iVar12 = *(int *)(*(long *)(_o + 8) + 0x2e8);
    break;
  case 3:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x2d0) >> 1;
    goto LAB_00498886;
  case 4:
    QVar9 = iconSize((QTabBar *)_o);
    *pQVar4 = QVar9;
    goto LAB_004988a3;
  case 5:
    iVar12 = *(int *)(*(long *)(_o + 8) + 0x2ac);
    break;
  case 6:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x2d0) >> 3;
    goto LAB_00498886;
  case 7:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x2d0) >> 6;
    goto LAB_00498886;
  case 8:
    iVar12 = *(int *)(*(long *)(_o + 8) + 0x2b0);
    break;
  case 9:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x2d0) >> 5;
    goto LAB_00498886;
  case 10:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x2d1);
LAB_00498886:
    *(byte *)&(pQVar4->wd).m_i = bVar7 & 1;
    goto LAB_004988a3;
  case 0xb:
    bVar7 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x2d0) >> 10);
    goto LAB_00498865;
  case 0xc:
    bVar7 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x2d0) >> 0xb);
    goto LAB_00498865;
  case 0xd:
    bVar7 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x2d0) >> 0xc);
LAB_00498865:
    *(byte *)&(pQVar4->wd).m_i = bVar7 & 1;
    goto LAB_004988a3;
  }
  (pQVar4->wd).m_i = iVar12;
LAB_004988a3:
  if (_c != WriteProperty) goto switchD_0049854e_caseD_3;
switchD_0049854e_caseD_2:
  if (0xd < (uint)_id) goto switchD_0049854e_caseD_3;
  pTVar5 = (TextElideMode *)*_a;
  switch(_id) {
  case 0:
    pQVar13 = *(QTabBarPrivate **)(_o + 8);
    if (pQVar13->shape == *pTVar5) break;
    pQVar13->shape = *pTVar5;
    goto LAB_0049891c;
  case 1:
    setCurrentIndex((QTabBar *)_o,*pTVar5);
    break;
  case 3:
    uVar8 = *(ushort *)(*(long *)(_o + 8) + 0x2d0);
    if (((uVar8 & 2) == 0) == (bool)(char)*pTVar5) {
      *(ushort *)(*(long *)(_o + 8) + 0x2d0) = (uVar8 & 0xfffd) + (ushort)(byte)(char)*pTVar5 * 2;
      QWidget::update((QWidget *)_o);
    }
    break;
  case 4:
    lVar10 = *(long *)(_o + 8);
    *(undefined8 *)(lVar10 + 0x27c) = *(undefined8 *)pTVar5;
    pbVar1 = (byte *)(lVar10 + 0x2d0);
    *pbVar1 = *pbVar1 | 1;
    QWidget::update((QWidget *)_o);
    QWidget::updateGeometry((QWidget *)_o);
    break;
  case 5:
    pQVar13 = *(QTabBarPrivate **)(_o + 8);
    pQVar13->elideMode = *pTVar5;
    pQVar13->field_0x2d0 = pQVar13->field_0x2d0 | 4;
    QHash<QString,_QSize>::clear(&pQVar13->textSizes);
LAB_0049891c:
    QTabBarPrivate::refresh(pQVar13);
    break;
  case 6:
    setUsesScrollButtons((QTabBar *)_o,SUB41(*pTVar5,0));
    break;
  case 7:
    setTabsClosable((QTabBar *)_o,SUB41(*pTVar5,0));
    break;
  case 8:
    *(TextElideMode *)(*(long *)(_o + 8) + 0x2b0) = *pTVar5;
    break;
  case 9:
    pQVar13 = *(QTabBarPrivate **)(_o + 8);
    if (((*(ushort *)&pQVar13->field_0x2d0 & 0x20) == 0) == (bool)(char)*pTVar5) {
      *(ushort *)&pQVar13->field_0x2d0 =
           *(ushort *)&pQVar13->field_0x2d0 & 0xffdf | (ushort)(byte)(char)*pTVar5 << 5;
      QTabBarPrivate::layoutTabs(pQVar13);
    }
    break;
  case 10:
    lVar10 = *(long *)(_o + 8);
    uVar8 = (ushort)(byte)(char)*pTVar5 << 8;
    uVar11 = 0xfeff;
    goto LAB_00498a1a;
  case 0xb:
    lVar10 = *(long *)(_o + 8);
    uVar8 = (ushort)(byte)(char)*pTVar5 << 10;
    uVar11 = 0xfbff;
LAB_00498a1a:
    *(ushort *)(lVar10 + 0x2d0) = uVar11 & (ushort)*(undefined4 *)(lVar10 + 0x2d0) | uVar8;
    break;
  case 0xc:
    setAutoHide((QTabBar *)_o,SUB41(*pTVar5,0));
    break;
  case 0xd:
    TVar6 = *pTVar5;
    lVar10 = *(long *)(_o + 8);
    *(ushort *)(lVar10 + 0x2d0) =
         (ushort)*(undefined4 *)(lVar10 + 0x2d0) & 0xefff | (ushort)(byte)(char)TVar6 << 0xc;
    if ((char)TVar6 == ElideLeft) {
      QBasicTimer::stop();
      *(undefined4 *)(lVar10 + 0x2a4) = 0xffffffff;
    }
  }
switchD_0049854e_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTabBar *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->tabCloseRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->tabMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->tabBarClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->tabBarDoubleClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::currentChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::tabCloseRequested, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int , int )>(_a, &QTabBar::tabMoved, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::tabBarClicked, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::tabBarDoubleClicked, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Shape*>(_v) = _t->shape(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->drawBase(); break;
        case 4: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 5: *reinterpret_cast<Qt::TextElideMode*>(_v) = _t->elideMode(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->usesScrollButtons(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->tabsClosable(); break;
        case 8: *reinterpret_cast<SelectionBehavior*>(_v) = _t->selectionBehaviorOnRemove(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->expanding(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->isMovable(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->autoHide(); break;
        case 13: *reinterpret_cast<bool*>(_v) = _t->changeCurrentOnDrag(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setShape(*reinterpret_cast<Shape*>(_v)); break;
        case 1: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setDrawBase(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 5: _t->setElideMode(*reinterpret_cast<Qt::TextElideMode*>(_v)); break;
        case 6: _t->setUsesScrollButtons(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setTabsClosable(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setSelectionBehaviorOnRemove(*reinterpret_cast<SelectionBehavior*>(_v)); break;
        case 9: _t->setExpanding(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setMovable(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 12: _t->setAutoHide(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setChangeCurrentOnDrag(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}